

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&>
          (char (*arg) [2],unsigned_long *args,char (*args_1) [2],char *args_2)

{
  char (*in_RCX) [2];
  unsigned_long *in_RDX;
  undefined8 in_RDI;
  char *in_R8;
  string local_68 [16];
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffffa8);
  StringBuilder<unsigned_long,char_const(&)[2],char&>(in_RDX,in_RCX,in_R8);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}